

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::yxline(Fl_PostScript_Graphics_Driver *this,int x,int y,int y1,int x2)

{
  int x2_local;
  int y1_local;
  int y_local;
  int x_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  fprintf((FILE *)this->output,"GS\n");
  fprintf((FILE *)this->output,"BP\n");
  fprintf((FILE *)this->output,"%i %i MT\n",(ulong)(uint)x,(ulong)(uint)y);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x,(ulong)(uint)y1);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x2,(ulong)(uint)y1);
  fprintf((FILE *)this->output,"ELP\n");
  fprintf((FILE *)this->output,"GR\n");
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::yxline(int x, int y, int y1, int x2){
  fprintf(output, "GS\n");
  fprintf(output,"BP\n");
  fprintf(output, "%i %i MT\n", x , y);
  fprintf(output, "%i %i LT\n", x , y1);
  fprintf(output, "%i %i LT\n", x2 , y1);
  fprintf(output, "ELP\n");
  fprintf(output, "GR\n");
}